

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O3

void oonf_log_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  long lVar4;
  
  plVar2 = (_handler_list.next)->prev;
  plVar3 = _handler_list.next;
  while (plVar2 != _handler_list.prev) {
    plVar1 = plVar3->next;
    plVar2->next = plVar1;
    plVar1->prev = plVar2;
    plVar3->next = (list_entity *)0x0;
    plVar3->prev = (list_entity *)0x0;
    oonf_log_updatemask();
    plVar3 = plVar1;
    plVar2 = plVar1->prev;
  }
  lVar4 = 6;
  do {
    free(LOG_SOURCE_NAMES[lVar4]);
    LOG_SOURCE_NAMES[lVar4] = (char *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x80);
  abuf_free(&_logbuffer);
  return;
}

Assistant:

void
oonf_log_cleanup(void) {
  struct oonf_log_handler_entry *h, *iterator;
  enum oonf_log_source src;

  /* remove all handlers */
  list_for_each_element_safe(&_handler_list, h, _node, iterator) {
    oonf_log_removehandler(h);
  }

  for (src = LOG_CORESOURCE_COUNT; src < LOG_MAXIMUM_SOURCES; src++) {
    free((void *)LOG_SOURCE_NAMES[src]);
    LOG_SOURCE_NAMES[src] = NULL;
  }
  abuf_free(&_logbuffer);
}